

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall
asl::HttpServer::serveFile(HttpServer *this,HttpRequest *request,HttpResponse *response)

{
  undefined8 uVar1;
  bool bVar2;
  String *pSVar3;
  String local_238;
  String local_220;
  String local_208;
  String local_1f0;
  undefined1 local_1d8 [60];
  undefined4 local_19c;
  Date local_198;
  undefined1 local_190 [56];
  Date local_158;
  Date ifdate;
  String local_138;
  String local_120;
  String local_108;
  String local_f0;
  String local_d8;
  String local_c0;
  undefined1 local_a8 [8];
  File file;
  String localpath;
  undefined1 local_38 [8];
  String path;
  HttpResponse *response_local;
  HttpRequest *request_local;
  HttpServer *this_local;
  
  path.field_2._8_8_ = response;
  pSVar3 = HttpRequest::method(request);
  bVar2 = asl::String::operator==(pSVar3,"GET");
  if (!bVar2) {
    HttpResponse::setCode((HttpResponse *)path.field_2._8_8_,0x1f5);
    uVar1 = path.field_2._8_8_;
    asl::String::String(&local_220,"Content-Type");
    asl::String::String(&local_238,"text/plain");
    HttpMessage::setHeader((HttpMessage *)uVar1,&local_220,&local_238);
    asl::String::~String(&local_238);
    asl::String::~String(&local_220);
    HttpMessage::put((HttpMessage *)path.field_2._8_8_,"Not implemented");
    return;
  }
  pSVar3 = HttpRequest::path(request);
  asl::String::String((String *)local_38,pSVar3);
  bVar2 = asl::String::endsWith((String *)local_38,"/");
  if (bVar2) {
    asl::String::operator+=((String *)local_38,"index.html");
  }
  asl::String::operator+((String *)&file._endian,&this->_webroot,(String *)local_38);
  File::File((File *)local_a8,(String *)&file._endian);
  bVar2 = File::isDirectory((File *)local_a8);
  if (bVar2) {
    HttpResponse::setCode((HttpResponse *)path.field_2._8_8_,0x12d);
    uVar1 = path.field_2._8_8_;
    asl::String::String(&local_c0,"Location");
    asl::String::String(&local_138,"Host");
    HttpMessage::header(&local_120,&request->super_HttpMessage,&local_138);
    operator+(&local_108,"http://",&local_120);
    asl::String::operator+(&local_f0,&local_108,(String *)local_38);
    asl::String::operator+(&local_d8,&local_f0,'/');
    HttpMessage::setHeader((HttpMessage *)uVar1,&local_c0,&local_d8);
    asl::String::~String(&local_d8);
    asl::String::~String(&local_f0);
    asl::String::~String(&local_108);
    asl::String::~String(&local_120);
    asl::String::~String(&local_138);
    asl::String::~String(&local_c0);
  }
  else {
    bVar2 = File::exists((File *)local_a8);
    if (bVar2) {
      asl::String::String((String *)&ifdate,"If-Modified-Since");
      bVar2 = HttpMessage::hasHeader(&request->super_HttpMessage,(String *)&ifdate);
      asl::String::~String((String *)&ifdate);
      if (bVar2) {
        asl::String::String((String *)(local_190 + 8),"If-Modified-Since");
        HttpMessage::header((String *)(local_190 + 0x20),&request->super_HttpMessage,
                            (String *)(local_190 + 8));
        Date::Date(&local_158,(String *)(local_190 + 0x20));
        asl::String::~String((String *)(local_190 + 0x20));
        asl::String::~String((String *)(local_190 + 8));
        File::lastModified((File *)local_190);
        Date::operator+(&local_198,1.0);
        bVar2 = Date::operator<=((Date *)local_190,&local_198);
        if (bVar2) {
          HttpResponse::setCode((HttpResponse *)path.field_2._8_8_,0x130);
          local_19c = 1;
          goto LAB_0013f560;
        }
      }
      uVar1 = path.field_2._8_8_;
      asl::String::String((String *)(local_1d8 + 0x20),"Last-Modified");
      File::lastModified((File *)local_1d8);
      Date::toString((String *)(local_1d8 + 8),(Date *)local_1d8,HTTP);
      HttpMessage::setHeader
                ((HttpMessage *)uVar1,(String *)(local_1d8 + 0x20),(String *)(local_1d8 + 8));
      asl::String::~String((String *)(local_1d8 + 8));
      asl::String::~String((String *)(local_1d8 + 0x20));
      HttpMessage::put((HttpMessage *)path.field_2._8_8_,(File *)local_a8);
    }
    else {
      HttpResponse::setCode((HttpResponse *)path.field_2._8_8_,0x194);
      uVar1 = path.field_2._8_8_;
      asl::String::String(&local_1f0,"Content-Type");
      asl::String::String(&local_208,"text/plain");
      HttpMessage::setHeader((HttpMessage *)uVar1,&local_1f0,&local_208);
      asl::String::~String(&local_208);
      asl::String::~String(&local_1f0);
      HttpMessage::put((HttpMessage *)path.field_2._8_8_,"Not found");
    }
  }
  local_19c = 0;
LAB_0013f560:
  File::~File((File *)local_a8);
  asl::String::~String((String *)&file._endian);
  asl::String::~String((String *)local_38);
  return;
}

Assistant:

void HttpServer::serveFile(HttpRequest& request, HttpResponse& response)
{
	if (request.method() == "GET")
	{
		String path = request.path();

		if (path.endsWith("/"))
			path += "index.html";

		String localpath = _webroot + path;
		File file(localpath);
		if (file.isDirectory())
		{
			response.setCode(301);
			response.setHeader("Location", "http://" + request.header("Host") + path + '/');
		}
		else if (file.exists())
		{
			if (request.hasHeader("If-Modified-Since"))
			{
				Date ifdate = request.header("If-Modified-Since");
				if (file.lastModified() <= ifdate + 1.0) {
					response.setCode(304);
					return;
				}
			}
			response.setHeader("Last-Modified", file.lastModified().toString(Date::HTTP));
			response.put(file);
		}
		else
		{
			response.setCode(404);
			response.setHeader("Content-Type", "text/plain");
			response.put("Not found");
		}
	}
	else
	{
		response.setCode(501);
		response.setHeader("Content-Type", "text/plain");
		response.put("Not implemented");
	}
}